

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O1

int luabridge::detail::
    Invoke<void,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<char_const*,void>>,1>
    ::run<void(*)(char_const*,char_const*)>(lua_State *L,_func_void_char_ptr_char_ptr **fn)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = Stack<const_char_*>::get(L,1);
  pcVar2 = Stack<const_char_*>::get(L,2);
  (**fn)(pcVar1,pcVar2);
  return 0;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            FuncTraits<Fn>::call(fn, args);
            return 0;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }